

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noises.cxx
# Opt level: O3

void __thiscall NoiseSource::NoiseSource(NoiseSource *this,Time *time,Matrix *a)

{
  string local_168;
  string local_148;
  Matrix local_128;
  
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"");
  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"Stochastic","");
  StochasticProcess::StochasticProcess(&this->super_StochasticProcess,time,&local_148,&local_168);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
  }
  RandN::RandN((RandN *)this);
  (this->super_StochasticProcess).super_Parametric._vptr_Parametric =
       (_func_int **)&PTR__NoiseSource_0015d170;
  (this->super_StochasticProcess).super_TimeDependent._vptr_TimeDependent =
       (_func_int **)&PTR__NoiseSource_0015d1f8;
  (this->super_StochasticProcess).super_Physical._vptr_Physical =
       (_func_int **)&PTR__NoiseSource_0015d240;
  Matrix::Matrix(&local_128,a);
  setMixingMatrix(this,&local_128);
  Matrix::~Matrix(&local_128);
  return;
}

Assistant:

NoiseSource::NoiseSource(Time *time, Matrix a )
	: StochasticProcess(time)
{
	setMixingMatrix(a);
}